

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int isCarbonylAtom(atom *a)

{
  int iVar1;
  char *pcVar2;
  bool local_12;
  bool local_11;
  atom *a_local;
  
  pcVar2 = strstr(AAList,a->r->resname);
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(a->atomname," C  ");
    local_11 = true;
    if (iVar1 == 0) goto LAB_0012a8d8;
  }
  pcVar2 = strstr(":ASP:ASN:ASX:",a->r->resname);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strstr(": CG :",a->atomname);
    local_11 = true;
    if (pcVar2 != (char *)0x0) goto LAB_0012a8d8;
  }
  pcVar2 = strstr(":GLU:GLN:GLX:",a->r->resname);
  local_12 = false;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strstr(": CD :",a->atomname);
    local_12 = pcVar2 != (char *)0x0;
  }
  local_11 = local_12;
LAB_0012a8d8:
  return (int)local_11;
}

Assistant:

int isCarbonylAtom(atom *a) { /* limitation: this will not handle het groups properly */
   return (strstr(AAList, a->r->resname) && (!strcmp(a->atomname,  " C  ")))
   ||((strstr(":ASP:ASN:ASX:",a->r->resname))&&(strstr(": CG :",a->atomname)))
   ||((strstr(":GLU:GLN:GLX:",a->r->resname))&&(strstr(": CD :",a->atomname)));
}